

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz-test.c++
# Opt level: O2

void capnp::_::anon_unknown_0::fuzz<capnp::_::(anonymous_namespace)::StructChecker>
               (ArrayPtr<capnp::word> data,uint flipCount,uint startAt,uint endAt)

{
  byte *pbVar1;
  byte bVar2;
  uint flipCount_00;
  word *pwVar3;
  ulong uVar4;
  byte bVar5;
  undefined1 in_stack_00000010 [16];
  
  pwVar3 = data.ptr;
  if (flipCount != 0) {
    flipCount_00 = flipCount - 1;
    while (startAt < endAt) {
      uVar4 = (ulong)(startAt >> 3);
      bVar2 = *(byte *)((long)&pwVar3->content + uVar4);
      bVar5 = (byte)(1 << ((byte)startAt & 7));
      *(byte *)((long)&pwVar3->content + uVar4) = bVar2 | bVar5;
      startAt = startAt + 1;
      fuzz<capnp::_::(anonymous_namespace)::StructChecker>(data,flipCount_00,startAt,endAt);
      pbVar1 = (byte *)((long)&pwVar3->content + uVar4);
      *pbVar1 = *pbVar1 & ~bVar5;
      fuzz<capnp::_::(anonymous_namespace)::StructChecker>(data,flipCount_00,startAt,endAt);
      *(byte *)((long)&pwVar3->content + uVar4) = bVar5;
      fuzz<capnp::_::(anonymous_namespace)::StructChecker>(data,flipCount_00,startAt,endAt);
      *(byte *)((long)&pwVar3->content + uVar4) = bVar2;
    }
    return;
  }
  traverseCatchingExceptions<capnp::_::(anonymous_namespace)::StructChecker>
            ((ArrayPtr<const_capnp::word>)in_stack_00000010);
  return;
}

Assistant:

void fuzz(kj::ArrayPtr<word> data, uint flipCount, uint startAt, uint endAt) {
  if (flipCount == 0) {
    traverseCatchingExceptions<Checker>(data);
  } else {
    for (uint i = startAt; i < endAt; i++) {
      byte bit = 1u << (i % 8);
      byte old = data.asBytes()[i / 8];
      data.asBytes()[i / 8] |= bit;
      fuzz<Checker>(data, flipCount - 1, i + 1, endAt);
      data.asBytes()[i / 8] &= ~bit;
      fuzz<Checker>(data, flipCount - 1, i + 1, endAt);
      data.asBytes()[i / 8] = bit;
      fuzz<Checker>(data, flipCount - 1, i + 1, endAt);
      data.asBytes()[i / 8] = old;
    }
  }
}